

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O1

iterator * __thiscall
idx2::Lookup<unsigned_long,idx2::chunk_exp_cache>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_exp_cache> *Ht,unsigned_long *Key)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = (byte)*(undefined8 *)(this + 0x20);
  uVar5 = (ulong)((long)Ht->Keys * -0x61c8864680b583eb) >> (-bVar2 & 0x3f);
  lVar1 = *(long *)(this + 0x10);
  uVar4 = uVar5;
  do {
    if (*(char *)(lVar1 + uVar4) == '\0') break;
    if (*(unsigned_long **)(*(long *)this + uVar4 * 8) == Ht->Keys) {
      bVar3 = true;
      goto LAB_00194c28;
    }
    uVar4 = uVar4 + 1 & ~(-1L << (bVar2 & 0x3f));
  } while (uVar4 != uVar5);
  bVar3 = false;
LAB_00194c28:
  if ((!bVar3) && (*(char *)(lVar1 + uVar4) == '\x02')) {
    do {
      uVar4 = uVar4 + 1 & ~(-1L << (bVar2 & 0x3f));
    } while (*(char *)(lVar1 + uVar4) == '\x02');
  }
  __return_storage_ptr__->Key = (unsigned_long *)(uVar4 * 8 + *(long *)this);
  __return_storage_ptr__->Val = (chunk_exp_cache *)(uVar4 * 0x40 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)this;
  __return_storage_ptr__->Idx = uVar4;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Lookup(const hash_table<k, v>& Ht, const k& Key)
{
  i64 H = Index(Ht, Hash(Key));
  i64 Start = H;
  bool Found = false;
  while (Ht.Stats[H] != hash_table<k, v>::Empty)
  { // either Occupied or Tombstone
    if (Ht.Keys[H] == Key)
    {
      Found = true;
      break;
    }
    ++H;
    if ((H &= Capacity(Ht) - 1) == Start)
      break;
  }
  if (!Found)
  {
    while (Ht.Stats[H] == hash_table<k, v>::Occupied)
    {
      ++H;
      H &= Capacity(Ht) - 1;
    }
  }
  auto Result = IterAt(Ht, H);
  if (Found)
  {
    idx2_Assert(*Result.Key == Key);
  }
  return Result;
}